

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDecompressToYUV2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width
                      ,int pad,int height,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  void *__dest;
  uint uVar6;
  long lVar7;
  size_t __n;
  uint local_54;
  uint local_50;
  uint local_4c;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (handle == (tjhandle)0x0) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_00199f20);
    *(undefined8 *)((long)puVar5 + 7) = 0x656c646e616820;
    *puVar5 = 0x2064696c61766e49;
  }
  else {
    *(undefined4 *)((long)handle + 0x5f8) = 0;
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
    if ((pad < 1 ||
         ((width < 0 || dstBuf == (uchar *)0x0) || (jpegSize == 0 || jpegBuf == (uchar *)0x0))) ||
       ((pad & pad - 1U) != 0 || height < 0)) {
      builtin_strncpy((char *)((long)handle + 0x618),"V2(): In",8);
      builtin_strncpy((char *)((long)handle + 0x620),"valid ar",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
      builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
      *(undefined8 *)((long)handle + 0x627) = 0x746e656d756772;
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pcVar4 = (char *)__tls_get_addr(&PTR_00199f20);
      builtin_strncpy(pcVar4,"tjDecompressToYUV2(): Invalid argument",0x27);
    }
    else {
      iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar1 != 0) {
        return -1;
      }
      cinfo = (j_decompress_ptr)((long)handle + 0x208);
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      jpeg_read_header(cinfo,1);
      iVar1 = getSubsamp(cinfo);
      if (iVar1 < 0) {
        pcVar4 = "tjDecompressToYUV2(): Could not determine subsampling type for JPEG image";
        __n = 0x4a;
      }
      else {
        if (width == 0) {
          width = *(int *)((long)handle + 0x238);
        }
        if (height == 0) {
          height = *(int *)((long)handle + 0x23c);
        }
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          iVar2 = sf[lVar7].denom;
          if (((sf[lVar7].num * *(int *)((long)handle + 0x238) + iVar2 + -1) / iVar2 <= width) &&
             ((sf[lVar7].num * *(int *)((long)handle + 0x23c) + iVar2 + -1) / iVar2 <= height)) {
            iVar2 = tjPlaneWidth(0,width,iVar1);
            iVar3 = tjPlaneHeight(0,height,iVar1);
            uVar6 = (pad + iVar2) - 1U & -pad;
            local_54 = uVar6;
            local_48 = dstBuf;
            if (iVar1 == 3) {
              local_50 = 0;
              local_38 = (uchar *)0x0;
              local_40 = local_38;
            }
            else {
              iVar2 = tjPlaneWidth(1,width,iVar1);
              iVar1 = tjPlaneHeight(1,height,iVar1);
              local_50 = (pad - 1U) + iVar2 & -pad;
              local_40 = dstBuf + (int)(uVar6 * iVar3);
              local_38 = local_40 + (int)(iVar1 * local_50);
            }
            *(undefined4 *)((long)handle + 0x604) = 1;
            local_4c = local_50;
            iVar1 = tjDecompressToYUVPlanes
                              (handle,jpegBuf,jpegSize,&local_48,width,(int *)&local_54,height,flags
                              );
            return iVar1;
          }
        }
        pcVar4 = "tjDecompressToYUV2(): Could not scale down to desired image dimensions";
        __n = 0x47;
      }
      memcpy((void *)((long)handle + 0x608),pcVar4,__n);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      __dest = (void *)__tls_get_addr(&PTR_00199f20);
      memcpy(__dest,pcVar4,__n);
    }
    *(undefined4 *)((long)handle + 0x5fc) = 0;
  }
  return -1;
}

Assistant:

DLLEXPORT int tjDecompressToYUV2(tjhandle handle, const unsigned char *jpegBuf,
                                 unsigned long jpegSize, unsigned char *dstBuf,
                                 int width, int pad, int height, int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1, jpegSubsamp = -1;
  int i, jpegwidth, jpegheight, scaledw, scaledh;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pad < 1 || !IS_POW2(pad) || height < 0)
    THROW("tjDecompressToYUV2(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUV2(): Could not determine subsampling type for JPEG image");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;

  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUV2(): Could not scale down to desired image dimensions");

  pw0 = tjPlaneWidth(0, width, jpegSubsamp);
  ph0 = tjPlaneHeight(0, height, jpegSubsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (jpegSubsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, jpegSubsamp);
    int ph1 = tjPlaneHeight(1, height, jpegSubsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  this->headerRead = 1;
  return tjDecompressToYUVPlanes(handle, jpegBuf, jpegSize, dstPlanes, width,
                                 strides, height, flags);

bailout:
  this->jerr.stopOnWarning = FALSE;
  return retval;
}